

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O3

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cmValue cVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  size_type *psVar7;
  string forcedOption;
  cmCPackIFWPackage package;
  string local_378;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  string local_338;
  cmCPackIFWPackage local_318;
  
  if (((this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (bVar2 = cmCPackIFWGenerator::IsOnePackage((this->super_cmCPackIFWCommon).Generator), bVar2)) {
    cmCPackIFWPackage::cmCPackIFWPackage(&local_318);
    local_318.super_cmCPackIFWCommon.Generator = (this->super_cmCPackIFWCommon).Generator;
    paVar1 = &local_378.field_2;
    local_378._M_dataplus._M_p = (pointer)paVar1;
    local_318.Installer = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_378,"CPACK_IFW_PACKAGE_GROUP","");
    cVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (cVar3.Value == (string *)0x0) {
      cmCPackIFWPackage::ConfigureFromOptions(&local_318);
    }
    else {
      cmCPackIFWPackage::ConfigureFromGroup(&local_318,cVar3.Value);
      cmsys::SystemTools::UpperCase(&local_338,cVar3.Value);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x6cc15f);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_348 = *plVar6;
        lStack_340 = plVar4[3];
        local_358 = &local_348;
      }
      else {
        local_348 = *plVar6;
        local_358 = (long *)*plVar4;
      }
      local_350 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_358);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_378.field_2._M_allocated_capacity = *psVar7;
        local_378.field_2._8_8_ = plVar4[3];
        local_378._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_378.field_2._M_allocated_capacity = *psVar7;
        local_378._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_378._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      cVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_378);
      if (cVar3.Value == (string *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_318.ForcedInstallation,0,
                   (char *)local_318.ForcedInstallation._M_string_length,0x6caa4c);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != paVar1) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
    }
    cmCPackIFWPackage::GeneratePackageFile(&local_318);
    cmCPackIFWPackage::~cmCPackIFWPackage(&local_318);
  }
  else {
    for (p_Var5 = (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      cmCPackIFWPackage::GeneratePackageFile(*(cmCPackIFWPackage **)(p_Var5 + 2));
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (this->Packages.empty() || this->Generator->IsOnePackage()) {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = this->Generator;
    package.Installer = this;
    // Check package group
    if (cmValue option = this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
      package.ConfigureFromGroup(option);
      std::string forcedOption = "CPACK_IFW_COMPONENT_GROUP_" +
        cmsys::SystemTools::UpperCase(option) + "_FORCED_INSTALLATION";
      if (!this->GetOption(forcedOption)) {
        package.ForcedInstallation = "true";
      }
    } else {
      package.ConfigureFromOptions();
    }
    package.GeneratePackageFile();
    return;
  }

  // Generate packages meta information
  for (auto& p : this->Packages) {
    cmCPackIFWPackage* package = p.second;
    package->GeneratePackageFile();
  }
}